

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> __thiscall
duckdb::StringUtil::ParseJSONMap(StringUtil *this,string *json,bool ignore_errors)

{
  ulong uVar1;
  _func_void_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  pointer pcVar4;
  ComplexJSON *pCVar5;
  yyjson_doc *pyVar6;
  pointer pCVar7;
  SerializationException *pSVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  yyjson_val *key;
  yyjson_val *pyVar13;
  yyjson_val *pyVar14;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> nested_result;
  size_t json_str_len;
  string local_130;
  uint local_10c;
  _Head_base<0UL,_duckdb::ComplexJSON_*,_false> local_108;
  yyjson_doc *local_100;
  _Head_base<0UL,_duckdb::ComplexJSON_*,_false> local_f8;
  uint local_ec;
  string *local_e8;
  yyjson_val_uni local_e0;
  ulong local_d8;
  __uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> local_d0;
  _Head_base<0UL,_duckdb::ComplexJSON_*,_false> local_c8;
  string local_c0;
  ulong local_a0;
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pCVar5 = (ComplexJSON *)operator_new(0x60);
  ComplexJSON::ComplexJSON(pCVar5,json);
  *(ComplexJSON **)this = pCVar5;
  if (json->_M_string_length != 0) {
    pyVar6 = duckdb_yyjson::yyjson_read_opts
                       ((json->_M_dataplus)._M_p,json->_M_string_length,0x40,(yyjson_alc *)0x0,
                        (yyjson_read_err *)0x0);
    if (pyVar6 == (yyjson_doc *)0x0) {
      if (!ignore_errors) {
        local_108._M_head_impl = (ComplexJSON *)this;
        pSVar8 = (SerializationException *)__cxa_allocate_exception(0x10);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"Failed to parse JSON string: %s","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar4 = (json->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + json->_M_string_length);
        SerializationException::SerializationException<std::__cxx11::string>
                  (pSVar8,(string *)&local_130,&local_50);
        __cxa_throw(pSVar8,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_10c = (uint)CONCAT71(in_register_00000011,ignore_errors);
      pyVar14 = pyVar6->root;
      local_100 = pyVar6;
      local_e8 = json;
      if ((pyVar14 == (yyjson_val *)0x0) || (uVar12 = pyVar14->tag, (~(uint)uVar12 & 7) != 0)) {
        p_Var2 = (pyVar6->alc).free;
        pvVar3 = (pyVar6->alc).ctx;
        (pyVar6->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (pyVar6->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (pyVar6->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (pyVar6->alc).ctx = (void *)0x0;
        if (pyVar6->str_pool != (char *)0x0) {
          (*p_Var2)(pvVar3,pyVar6->str_pool);
        }
        (*p_Var2)(pvVar3,pyVar6);
        if ((char)local_10c == '\0') {
          local_108._M_head_impl = (ComplexJSON *)this;
          pSVar8 = (SerializationException *)__cxa_allocate_exception(0x10);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"Failed to parse JSON string: %s","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar4 = (local_e8->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar4,pcVar4 + local_e8->_M_string_length);
          SerializationException::SerializationException<std::__cxx11::string>
                    (pSVar8,(string *)&local_130,&local_70);
          __cxa_throw(pSVar8,&SerializationException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
      }
      else {
        if (0xff < uVar12) {
          local_a0 = uVar12 >> 8;
          local_ec = local_10c & 0xff;
          uVar12 = 0;
          local_108._M_head_impl = (ComplexJSON *)this;
          do {
            pyVar6 = local_100;
            pyVar13 = pyVar14 + 1;
            uVar1 = pyVar14[2].tag;
            pcVar10 = pyVar14[2].uni.str;
            uVar9 = (uint)uVar1;
            local_98 = (char *)0x10;
            if ((~uVar9 & 6) == 0) {
              local_98 = pcVar10;
            }
            local_d8 = uVar12;
            if ((~(byte)uVar1 & 7) == 0) {
              uVar12 = pyVar13->tag;
              if (((uint)uVar12 & 7) == 5) {
                local_e0 = pyVar14[1].uni;
              }
              else {
                local_e0.u64 = 0;
              }
              pcVar10 = duckdb_yyjson::yyjson_val_write_opts
                                  (pyVar14 + 2,0,(yyjson_alc *)0x0,(usize *)&local_c0,
                                   (yyjson_write_err *)0x0);
              pyVar6 = local_100;
              if (pcVar10 == (char *)0x0) {
                p_Var2 = (local_100->alc).free;
                pvVar3 = (local_100->alc).ctx;
                (local_100->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
                (local_100->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
                (local_100->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
                (local_100->alc).ctx = (void *)0x0;
                if (local_100->str_pool != (char *)0x0) {
                  (*p_Var2)(pvVar3,local_100->str_pool);
                }
                (*p_Var2)(pvVar3,pyVar6);
                if ((char)local_10c != '\0') {
                  return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                          )(_Head_base<0UL,_duckdb::ComplexJSON_*,_false>)this;
                }
                pSVar8 = (SerializationException *)__cxa_allocate_exception(0x10);
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_130,"Failed to stringify nested JSON object","");
                SerializationException::SerializationException(pSVar8,&local_130);
                __cxa_throw(pSVar8,&SerializationException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_130,pcVar10,local_c0._M_dataplus._M_p + (long)pcVar10);
              ParseJSONMap((StringUtil *)&local_f8,&local_130,SUB41(local_ec,0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p);
              }
              pCVar7 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                       ::operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                                     *)this);
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_130,local_e0.u64,local_e0.str + (uVar12 >> 8));
              local_d0._M_t.
              super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
              .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
                   (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
                   (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
                   local_f8._M_head_impl;
              local_f8._M_head_impl = (ComplexJSON *)0x0;
              ComplexJSON::AddObject
                        (pCVar7,&local_130,
                         (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                          *)&local_d0);
              ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
              ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                           *)&local_d0);
              uVar12 = local_d8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p);
              }
              free(pcVar10);
              ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
              ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                           *)&local_f8);
            }
            else {
              if ((uVar9 & 7) != 5) {
                p_Var2 = (local_100->alc).free;
                pvVar3 = (local_100->alc).ctx;
                (local_100->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
                (local_100->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
                (local_100->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
                (local_100->alc).ctx = (void *)0x0;
                if (local_100->str_pool != (char *)0x0) {
                  (*p_Var2)(pvVar3,local_100->str_pool);
                }
                (*p_Var2)(pvVar3,pyVar6);
                if ((char)local_10c != '\0') {
                  return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                         )(unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                           )this;
                }
                pSVar8 = (SerializationException *)__cxa_allocate_exception(0x10);
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_130,"Failed to parse JSON string: %s","");
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                pcVar4 = (local_e8->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,pcVar4,pcVar4 + local_e8->_M_string_length);
                SerializationException::SerializationException<std::__cxx11::string>
                          (pSVar8,(string *)&local_130,&local_90);
                __cxa_throw(pSVar8,&SerializationException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              uVar12 = pyVar13->tag;
              if (((uint)uVar12 & 7) == 5) {
                pcVar11 = pyVar14[1].uni.str;
              }
              else {
                pcVar11 = (char *)0x0;
              }
              if ((uVar9 & 7) != 5) {
                pcVar10 = (char *)0x0;
              }
              pCVar7 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                       ::operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                                     *)local_108._M_head_impl);
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_130,pcVar11,pcVar11 + (uVar12 >> 8));
              this = (StringUtil *)local_108._M_head_impl;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,pcVar10,pcVar10 + (uVar1 >> 8));
              pCVar5 = (ComplexJSON *)operator_new(0x60);
              ComplexJSON::ComplexJSON(pCVar5,&local_c0);
              local_c8._M_head_impl = pCVar5;
              ComplexJSON::AddObject
                        (pCVar7,&local_130,
                         (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                          *)&local_c8);
              ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
              ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                           *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              uVar12 = local_d8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p);
              }
            }
            uVar12 = uVar12 + 1;
            pyVar14 = (yyjson_val *)(local_98 + (long)&pyVar13->tag);
          } while (uVar12 < local_a0);
        }
        pyVar6 = local_100;
        p_Var2 = (local_100->alc).free;
        pvVar3 = (local_100->alc).ctx;
        (local_100->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (local_100->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (local_100->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (local_100->alc).ctx = (void *)0x0;
        if (local_100->str_pool != (char *)0x0) {
          (*p_Var2)(pvVar3,local_100->str_pool);
        }
        (*p_Var2)(pvVar3,pyVar6);
      }
    }
  }
  return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
         (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)this;
}

Assistant:

unique_ptr<ComplexJSON> StringUtil::ParseJSONMap(const string &json, bool ignore_errors) {
	auto result = make_uniq<ComplexJSON>(json);
	if (json.empty()) {
		return result;
	}
	yyjson_read_flag flags = YYJSON_READ_ALLOW_INVALID_UNICODE;
	yyjson_doc *doc = yyjson_read(json.c_str(), json.size(), flags);
	if (!doc) {
		if (ignore_errors) {
			return result;
		}
		throw SerializationException("Failed to parse JSON string: %s", json);
	}
	yyjson_val *root = yyjson_doc_get_root(doc);
	if (!root || yyjson_get_type(root) != YYJSON_TYPE_OBJ) {
		yyjson_doc_free(doc);
		if (ignore_errors) {
			return result;
		}
		throw SerializationException("Failed to parse JSON string: %s", json);
	}
	yyjson_obj_iter iter;
	yyjson_obj_iter_init(root, &iter);
	yyjson_val *key, *value;
	while ((key = yyjson_obj_iter_next(&iter))) {
		value = yyjson_obj_iter_get_val(key);
		auto type = yyjson_get_type(value);
		if (type == YYJSON_TYPE_STR) {
			// Since this is a string, we can directly add the value
			const auto key_val = yyjson_get_str(key);
			const auto key_len = yyjson_get_len(key);
			const auto value_val = yyjson_get_str(value);
			const auto value_len = yyjson_get_len(value);
			result->AddObject(string(key_val, key_len), make_uniq<ComplexJSON>(string(value_val, value_len)));
		} else if (type == YYJSON_TYPE_OBJ) {
			// We recurse, this is a complex json
			const auto key_val = yyjson_get_str(key);
			const auto key_len = yyjson_get_len(key);
			// Convert the object value to a JSON string and recurse
			size_t json_str_len;
			char *json_str = yyjson_val_write(value, 0, &json_str_len);
			if (json_str) {
				auto nested_result = ParseJSONMap(string(json_str, json_str_len), ignore_errors);
				result->AddObject(string(key_val, key_len), std::move(nested_result));
				free(json_str); // Clean up the allocated string
			} else {
				yyjson_doc_free(doc);
				if (ignore_errors) {
					return result;
				}
				throw SerializationException("Failed to stringify nested JSON object");
			}
		} else {
			// Anything else is invalid.
			yyjson_doc_free(doc);
			if (ignore_errors) {
				return result;
			}
			throw SerializationException("Failed to parse JSON string: %s", json);
		}
	}
	yyjson_doc_free(doc);
	return result;
}